

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::TypeReferenceSyntax::setChild
          (TypeReferenceSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  logic_error *this_00;
  Token TVar2;
  ExpressionSyntax *local_158;
  string local_130;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined8 local_58;
  Info *local_50;
  ExpressionSyntax *local_48;
  ExpressionSyntax *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  TypeReferenceSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar2._0_8_;
    (this->typeKeyword).kind = (undefined2)local_28;
    (this->typeKeyword).field_0x2 = local_28._2_1_;
    (this->typeKeyword).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->typeKeyword).rawLen = local_28._4_4_;
    local_20 = TVar2.info;
    (this->typeKeyword).info = local_20;
    break;
  case 1:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar2._0_8_;
    (this->openParen).kind = (undefined2)local_38;
    (this->openParen).field_0x2 = local_38._2_1_;
    (this->openParen).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->openParen).rawLen = local_38._4_4_;
    local_30 = TVar2.info;
    (this->openParen).info = local_30;
    break;
  case 2:
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_158 = (ExpressionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_158 = SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar1);
    }
    local_48 = local_158;
    not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
              ((not_null<slang::syntax::ExpressionSyntax*> *)&local_40,&local_48);
    (this->expr).ptr = local_40;
    break;
  case 3:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_58 = TVar2._0_8_;
    (this->closeParen).kind = (undefined2)local_58;
    (this->closeParen).field_0x2 = local_58._2_1_;
    (this->closeParen).numFlags = (NumericTokenFlags)local_58._3_1_;
    (this->closeParen).rawLen = local_58._4_4_;
    local_50 = TVar2.info;
    (this->closeParen).info = local_50;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_f9);
    std::operator+(&local_d8,&local_f8,":");
    std::__cxx11::to_string(&local_130,0x330b);
    std::operator+(&local_b8,&local_d8,&local_130);
    std::operator+(&local_98,&local_b8,": ");
    std::operator+(&local_78,&local_98,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_78);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void TypeReferenceSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: typeKeyword = child.token(); return;
        case 1: openParen = child.token(); return;
        case 2: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 3: closeParen = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}